

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitLir.c
# Opt level: O0

void set_label(sljit_label *label,sljit_compiler *compiler)

{
  sljit_compiler *compiler_local;
  sljit_label *label_local;
  
  label->next = (sljit_label *)0x0;
  label->size = compiler->size;
  if (compiler->last_label == (sljit_label *)0x0) {
    compiler->labels = label;
  }
  else {
    compiler->last_label->next = label;
  }
  compiler->last_label = label;
  return;
}

Assistant:

static SLJIT_INLINE void set_label(struct sljit_label *label, struct sljit_compiler *compiler)
{
	label->next = NULL;
	label->size = compiler->size;
	if (compiler->last_label)
		compiler->last_label->next = label;
	else
		compiler->labels = label;
	compiler->last_label = label;
}